

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O3

void helper_lctlg(CPUS390XState_conflict *env,uint32_t r1,uint64_t a2,uint32_t r3)

{
  uint64_t uVar1;
  CPUS390XState_conflict *__mptr;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  target_ulong ptr;
  uintptr_t unaff_retaddr;
  
  if ((a2 & 7) == 0) {
    uVar3 = (ulong)r1;
    uVar1 = cpu_ldq_data_ra_s390x(env,a2,unaff_retaddr);
    bVar4 = r1 - 9 < 3 && env->cregs[uVar3] != uVar1;
    env->cregs[uVar3] = uVar1;
    if (r1 != r3) {
      ptr = a2 + 8;
      do {
        uVar2 = (int)uVar3 + 1U & 0xf;
        uVar3 = (ulong)uVar2;
        uVar1 = cpu_ldq_data_ra_s390x(env,ptr,unaff_retaddr);
        bVar4 = (bool)(bVar4 | (uVar2 - 9 < 3 && env->cregs[uVar3] != uVar1));
        env->cregs[uVar3] = uVar1;
        ptr = ptr + 8;
      } while (uVar2 != r3);
    }
    if ((bVar4) && (((env->psw).mask & 0x4000000000000000) != 0)) {
      s390_cpu_recompute_watchpoints((CPUState *)(env[-0x1e].vregs + 0xf));
    }
    tlb_flush_s390x((CPUState *)(env[-0x1e].vregs + 0xf));
    return;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

void HELPER(lctlg)(CPUS390XState *env, uint32_t r1, uint64_t a2, uint32_t r3)
{
    uintptr_t ra = GETPC();
    bool PERchanged = false;
    uint64_t src = a2;
    uint32_t i;

    if (src & 0x7) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    for (i = r1;; i = (i + 1) % 16) {
        uint64_t val = cpu_ldq_data_ra(env, src, ra);
        if (env->cregs[i] != val && i >= 9 && i <= 11) {
            PERchanged = true;
        }
        env->cregs[i] = val;
        HELPER_LOG("load ctl %d from 0x%" PRIx64 " == 0x%" PRIx64 "\n",
                   i, src, val);
        src += sizeof(uint64_t);

        if (i == r3) {
            break;
        }
    }

    if (PERchanged && env->psw.mask & PSW_MASK_PER) {
        s390_cpu_recompute_watchpoints(env_cpu(env));
    }

    tlb_flush(env_cpu(env));
}